

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

void __thiscall
spatial_region::f_init_cos
          (spatial_region *this,double a0y,double a0z,double xsigma,double ysigma,double zsigma,
          double x0,int sscos,bool b_sign,double x1,double phase,double y0,double z0,bool append,
          double phi,double xtarget,double ytarget,double ztarget)

{
  undefined8 *puVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  celle *pcVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uint uVar28;
  ulong uVar29;
  cellb *pcVar30;
  int k;
  ulong uVar31;
  long lVar32;
  int i;
  long lVar33;
  int j;
  long lVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [64];
  double dVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [64];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  double dVar112;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 in_register_000012c8 [56];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 in_register_00001308 [56];
  undefined1 auVar119 [16];
  undefined1 in_register_00001348 [56];
  undefined1 auVar121 [16];
  undefined1 in_register_00001388 [56];
  undefined1 auVar122 [16];
  double dVar124;
  double dVar125;
  undefined1 in_ZMM9 [64];
  undefined1 in_ZMM12 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [64];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [64];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [64];
  undefined1 in_ZMM25 [64];
  undefined1 in_ZMM26 [64];
  undefined1 auVar137 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar138 [64];
  undefined1 in_ZMM28 [64];
  undefined1 auVar139 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar140 [64];
  undefined1 in_ZMM30 [64];
  double local_288;
  double local_280;
  ulong local_278;
  double local_270;
  undefined1 local_258 [16];
  double local_248;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  ulong local_1c8;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_b8;
  undefined1 auVar38 [16];
  undefined1 auVar120 [64];
  undefined1 auVar123 [64];
  
  auVar44 = in_ZMM29._0_16_;
  auVar43 = in_ZMM27._0_16_;
  auVar42 = in_ZMM26._0_16_;
  auVar41 = in_ZMM28._0_16_;
  auVar126._8_56_ = in_register_00001388;
  auVar126._0_8_ = x1;
  auVar130._8_56_ = in_register_00001348;
  auVar130._0_8_ = x0;
  auVar106._8_56_ = in_register_00001308;
  auVar106._0_8_ = zsigma;
  auVar85._8_56_ = in_register_000012c8;
  auVar85._0_8_ = ysigma;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = z0;
  auVar120 = ZEXT1664(auVar119);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = y0;
  auVar123 = ZEXT1664(auVar122);
  if (sscos == 0) {
    dVar124 = ((xsigma + xsigma) * 2.5066282746310002) / 3.0;
    auVar35 = vunpcklpd_avx(auVar106._0_16_,auVar85._0_16_);
    auVar66._0_8_ = auVar35._0_8_ + auVar35._0_8_;
    auVar66._8_8_ = auVar35._8_8_ + auVar35._8_8_;
    auVar35._8_8_ = 0x40040d931ff62705;
    auVar35._0_8_ = 0x40040d931ff62705;
    auVar35 = vmulpd_avx512vl(auVar66,auVar35);
    auVar37._8_8_ = 0x4008000000000000;
    auVar37._0_8_ = 0x4008000000000000;
    auVar36 = vdivpd_avx512vl(auVar35,auVar37);
    goto LAB_0010c4fd;
  }
  if (sscos == 3) {
    dVar124 = ((xsigma + xsigma) * 2.5066282746310002) / 3.0;
  }
  else {
    if (sscos == 2) {
      dVar124 = ((xsigma + xsigma) * 2.5066282746310002) / 3.0;
      auVar36._8_8_ = ysigma * 100.0;
      auVar36._0_8_ = ysigma * 100.0;
      goto LAB_0010c4fd;
    }
    if (sscos != 1) {
      auVar36 = ZEXT816(0);
      dVar124 = 0.0;
      goto LAB_0010c4fd;
    }
    dVar124 = xsigma * 0.822;
  }
  auVar35 = vunpcklpd_avx(auVar106._0_16_,auVar85._0_16_);
  auVar39._8_8_ = 0x3fea4dd2f1a9fbe7;
  auVar39._0_8_ = 0x3fea4dd2f1a9fbe7;
  auVar36 = vmulpd_avx512vl(auVar35,auVar39);
LAB_0010c4fd:
  auVar45 = vcvtsi2sd_avx512f(in_ZMM9._0_16_,this->ny);
  auVar35 = vunpcklpd_avx(auVar122,auVar119);
  auVar122 = vmovhpd_avx(ZEXT816(0),0x3ff0000000000000);
  uVar28 = 0;
  dVar52 = this->dy;
  dVar4 = this->dz;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = y0 * y0;
  auVar37 = vfmadd231sd_fma(auVar40,auVar126._0_16_,auVar126._0_16_);
  auVar119 = vfmadd231sd_fma(auVar37,auVar119,auVar119);
  auVar87._0_8_ = auVar35._0_8_ ^ 0x8000000000000000;
  auVar87._8_8_ = auVar35._8_8_ ^ 0x8000000000000000;
  auVar119 = vsqrtsd_avx(auVar119,auVar119);
  auVar47._0_8_ = auVar119._0_8_;
  auVar121._0_8_ = -x1 / auVar47._0_8_;
  auVar121._8_8_ = in_register_00001388._0_8_ ^ 0x8000000000000000;
  auVar47._8_8_ = auVar47._0_8_;
  auVar119 = vdivpd_avx(auVar87,auVar47);
  dVar125 = auVar119._0_8_;
  auVar88._0_8_ = -dVar125;
  auVar88._8_8_ = auVar119._8_8_ ^ 0x8000000000000000;
  auVar35 = vshufpd_avx(auVar119,auVar119,1);
  auVar66 = vunpcklpd_avx(auVar88,auVar121);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar125 * dVar125;
  auVar37 = vfmadd231sd_fma(auVar67,auVar121,auVar121);
  auVar37 = vsqrtsd_avx(auVar37,auVar37);
  auVar46 = vcvtsi2sd_avx512f(in_ZMM12._0_16_,this->nz);
  auVar48._0_8_ = auVar37._0_8_;
  auVar48._8_8_ = auVar48._0_8_;
  if (auVar48._0_8_ != 0.0) {
    uVar28 = 0xff;
  }
  if (NAN(auVar48._0_8_)) {
    uVar28 = 0xff;
  }
  auVar37 = vdivpd_avx512vl(auVar66,auVar48);
  bVar23 = (bool)((byte)uVar28 & 1);
  auVar38._0_8_ = (double)((ulong)bVar23 * auVar37._0_8_ | (ulong)!bVar23 * auVar122._0_8_);
  bVar23 = (bool)((byte)(uVar28 >> 1) & 1);
  auVar38._8_8_ = (double)((ulong)bVar23 * auVar37._8_8_ | (ulong)!bVar23 * auVar122._8_8_);
  auVar68._0_8_ = auVar35._0_8_ ^ 0x8000000000000000;
  auVar68._8_8_ = 0x8000000000000000;
  auVar39 = vshufpd_avx512vl(auVar38,auVar121,1);
  auVar122 = vshufpd_avx(auVar38,auVar38,1);
  auVar37 = vunpcklpd_avx(ZEXT816(0),auVar38);
  auVar40 = vmulpd_avx512vl(auVar39,auVar68);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = auVar38._0_8_ * dVar125;
  auVar66 = vfmsub213sd_fma(auVar122,auVar121,auVar89);
  auVar122 = vfmadd213pd_fma(auVar37,auVar119,auVar40);
  if ((phi != 0.0) || (NAN(phi))) {
    auVar131._8_8_ = 0;
    auVar131._0_8_ = dVar4;
    vmovsd_avx512f(auVar131);
    vmovsd_avx512f(auVar45);
    auVar134._8_8_ = 0;
    auVar134._0_8_ = dVar52;
    vmovsd_avx512f(auVar134);
    vmovsd_avx512f(auVar46);
    local_248 = cos(phi);
    dVar52 = sin(phi);
    auVar27._8_8_ = extraout_XMM0_Qb;
    auVar27._0_8_ = local_248;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = local_b8;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = local_1c8;
    auVar123 = ZEXT864((ulong)y0);
    auVar120 = ZEXT864((ulong)z0);
    auVar113._8_8_ = local_248;
    auVar113._0_8_ = local_248;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = auVar66._0_8_ * dVar52;
    auVar37 = vfmadd213sd_fma(ZEXT816(0) << 0x40,auVar27,auVar90);
    auVar107._0_8_ = auVar122._0_8_ * dVar52;
    auVar107._8_8_ = auVar122._8_8_ * dVar52;
    auVar91._0_8_ = auVar38._0_8_ * dVar52;
    auVar91._8_8_ = auVar38._8_8_ * dVar52;
    auVar38 = vfmadd231pd_fma(auVar107,auVar38,auVar113);
    auVar122 = vfmsub231pd_fma(auVar91,auVar122,auVar113);
    auVar69._8_8_ = 0;
    auVar69._0_8_ = dVar52 * -0.0;
    auVar66 = vfmadd231sd_fma(auVar69,auVar66,auVar27);
    dVar52 = local_288;
    dVar4 = local_280;
    local_258 = auVar39;
  }
  else {
    auVar37 = ZEXT816(0);
  }
  auVar132._8_8_ = 0;
  auVar132._0_8_ = dVar4;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = dVar52;
  auVar126 = ZEXT1664(auVar37);
  auVar108._8_8_ = 0x8000000000000000;
  auVar108._0_8_ = 0x8000000000000000;
  auVar41 = vxorpd_avx512vl(auVar41,auVar41);
  auVar139 = ZEXT1664(auVar41);
  auVar42 = vxorpd_avx512vl(auVar42,auVar42);
  auVar137 = ZEXT1664(auVar42);
  auVar42 = vxorpd_avx512vl(auVar43,auVar43);
  auVar138 = ZEXT1664(auVar42);
  auVar42 = vxorpd_avx512vl(auVar44,auVar44);
  auVar140 = ZEXT1664(auVar42);
  lVar33 = 0;
  auVar42 = vmulsd_avx512f(auVar45,ZEXT816(0xbfe0000000000000));
  auVar43 = vmulsd_avx512f(auVar46,ZEXT816(0xbfe0000000000000));
  auVar41 = vxorpd_avx512vl(auVar130._0_16_,auVar108);
  auVar44 = vshufpd_avx512vl(auVar38,auVar38,1);
  auVar42 = vmulsd_avx512f(auVar135,auVar42);
  auVar130 = ZEXT1664(auVar42);
  auVar43 = vmulsd_avx512f(auVar132,auVar43);
  auVar133 = ZEXT1664(auVar43);
  vmovsd_avx512f(auVar42);
  vmovsd_avx512f(auVar43);
  auVar42 = vshufpd_avx(auVar36,auVar36,1);
  dVar112 = auVar42._0_8_;
  dVar86 = auVar36._0_8_;
  dVar52 = dVar112 * dVar112 * dVar112 * dVar112;
  dVar53 = 3.141592653589793 / dVar124;
  dVar54 = -dVar53;
  dVar4 = dVar124 * dVar124 * dVar124 * dVar124;
  dVar125 = dVar86 * dVar86 * dVar86 * dVar86;
  auVar106 = ZEXT864(0) << 0x40;
  auVar42 = vshufpd_avx512vl(auVar39,auVar119,1);
  auVar43 = vshufpd_avx512vl(auVar122,auVar122,1);
  auVar85 = ZEXT864(0) << 0x40;
  do {
    if (this->nx <= lVar33) {
      return;
    }
    auVar36 = vcvtsi2sd_avx512f(in_ZMM25._0_16_,(int)lVar33);
    auVar136 = ZEXT1664(auVar36);
    lVar34 = 0;
    vmovsd_avx512f(auVar36);
    for (; lVar34 < this->ny; lVar34 = lVar34 + 1) {
      auVar36 = vcvtsi2sd_avx512f(in_ZMM30._0_16_,(int)lVar34);
      in_ZMM25 = ZEXT1664(auVar36);
      lVar32 = 0;
      uVar31 = 0;
      vmovsd_avx512f(auVar36);
      while( true ) {
        auVar39 = auVar139._0_16_;
        auVar36 = auVar85._0_16_;
        auVar92 = auVar106._0_16_;
        auVar129._8_8_ = 0;
        auVar129._0_8_ = xtarget;
        auVar128._8_8_ = 0;
        auVar128._0_8_ = ytarget;
        local_218 = auVar140._0_16_;
        uVar29 = (ulong)this->nz;
        if ((long)uVar29 <= (long)uVar31) break;
        auVar114._8_8_ = 0;
        auVar114._0_8_ = this->dy;
        auVar109._8_8_ = 0;
        auVar109._0_8_ = this->dx;
        auVar117._0_8_ = (double)(int)uVar31;
        auVar117._8_8_ = auVar119._8_8_;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = this->dz;
        auVar45 = vfmadd132sd_avx512f(auVar117,auVar133._0_16_,auVar5);
        auVar46 = vfmadd213sd_avx512f(auVar114,in_ZMM25._0_16_,auVar130._0_16_);
        auVar40 = vfmadd213sd_avx512f(auVar109,auVar136._0_16_,auVar41);
        auVar40 = vsubsd_avx512f(auVar40,auVar129);
        auVar118._8_8_ = 0;
        auVar118._0_8_ = auVar45._0_8_ - auVar120._0_8_;
        auVar127._8_8_ = 0;
        auVar127._0_8_ = ztarget;
        auVar47 = vsubsd_avx512f(auVar118,auVar127);
        in_ZMM30 = ZEXT1664(auVar47);
        auVar115._8_8_ = 0;
        auVar115._0_8_ = auVar46._0_8_ - auVar123._0_8_;
        auVar46 = vsubsd_avx512f(auVar115,auVar128);
        auVar45 = vmulsd_avx512f(auVar119,auVar46);
        auVar45 = vfmadd231sd_avx512f(auVar45,auVar121,auVar40);
        auVar45 = vfmadd231sd_avx512f(auVar45,auVar35,auVar47);
        auVar45 = vucomisd_avx512f(auVar45);
        if (uVar29 < uVar31) {
          auVar6._8_8_ = 0;
          auVar6._0_8_ = -dVar124;
          auVar67 = vucomisd_avx512f(auVar6);
          if (uVar31 <= uVar29) goto LAB_0010ce94;
          auVar48 = vmulsd_avx512f(auVar44,auVar46);
          auVar48 = vfmadd231sd_avx512f(auVar48,auVar38,auVar40);
          auVar48 = vfmadd231sd_avx512f(auVar48,auVar126._0_16_,auVar47);
          vucomisd_avx512f(auVar48);
          if ((uVar31 <= uVar29) ||
             (auVar7._8_8_ = 0, auVar7._0_8_ = -dVar112, auVar48 = vucomisd_avx512f(auVar7),
             uVar31 <= uVar29)) goto LAB_0010ce94;
          auVar46 = vmulsd_avx512f(auVar43,auVar46);
          auVar46 = vfmadd213sd_fma(auVar40,auVar122,auVar46);
          auVar46 = vfmadd213sd_avx512f(auVar47,auVar66,auVar46);
          in_ZMM30 = ZEXT1664(auVar46);
          vucomisd_avx512f(auVar46);
          if (uVar31 <= uVar29) goto LAB_0010ce94;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = -dVar86;
          auVar46 = vucomisd_avx512f(auVar8);
          in_ZMM30 = ZEXT1664(auVar46);
          if (uVar31 <= uVar29) goto LAB_0010ce94;
          auVar87 = ZEXT816(0x400921fb54442d18);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = phase;
          auVar40 = vaddsd_avx512f(auVar67,auVar9);
          auVar47 = vmulsd_avx512f(auVar67,auVar87);
          dVar65 = auVar40._0_8_;
          dVar55 = auVar45._0_8_;
          if (sscos == 0) {
            vmovsd_avx512f(auVar46);
            vmovsd_avx512f(auVar48);
            dVar55 = (auVar47._0_8_ * 0.5) / dVar55;
            dVar56 = cos(dVar55);
            dVar57 = (local_288 * 3.141592653589793 * 0.5) / dVar112;
            local_288 = cos(dVar57);
            dVar58 = ((double)local_258._0_8_ * 3.141592653589793 * 0.5) / dVar86;
            local_258._0_8_ = cos(dVar58);
            dVar59 = sin(dVar55);
            dVar57 = sin(dVar57);
            dVar58 = sin(dVar58);
            dVar55 = (double)local_258._0_8_ * local_288 * local_288 * (double)local_258._0_8_;
            dVar60 = cos(dVar65);
            dVar61 = sin(dVar65);
            auVar97._8_8_ = 0;
            auVar97._0_8_ = dVar56;
            auVar14._8_8_ = 0;
            auVar14._0_8_ = dVar60 * dVar56;
            auVar75._8_8_ = 0;
            auVar75._0_8_ = dVar56 * dVar61 * dVar54 * dVar59;
            auVar36 = vfmadd231sd_fma(auVar75,auVar97,auVar14);
            local_248 = auVar36._0_8_ * dVar55 * a0y;
            dVar60 = sin(dVar65);
            dVar61 = cos(dVar65);
            auVar98._8_8_ = 0;
            auVar98._0_8_ = dVar56;
            auVar15._8_8_ = 0;
            auVar15._0_8_ = dVar60 * dVar56;
            auVar76._8_8_ = 0;
            auVar76._0_8_ = dVar56 * dVar61 * dVar53 * dVar59;
            auVar36 = vfmadd231sd_fma(auVar76,auVar98,auVar15);
            local_208._8_8_ = 0;
            local_208._0_8_ = auVar36._0_8_ * dVar55 * a0z;
            auVar26._8_8_ = 0x8000000000000000;
            auVar26._0_8_ = 0x8000000000000000;
            local_218 = vxorpd_avx512vl(local_208,auVar26);
            dVar55 = sin(dVar65);
            dVar59 = cos(dVar65);
            auVar99._8_8_ = 0;
            auVar99._0_8_ =
                 (((double)local_258._0_8_ *
                   (double)local_258._0_8_ * dVar56 * dVar56 * dVar55 * a0y * 3.141592653589793) /
                 dVar112) * local_288;
            auVar16._8_8_ = 0;
            auVar16._0_8_ = dVar57;
            auVar77._8_8_ = 0;
            auVar77._0_8_ =
                 ((local_288 * local_288 * dVar56 * dVar56 * dVar59 * a0z * -3.141592653589793) /
                 dVar86) * (double)local_258._0_8_ * dVar58;
            auVar36 = vfmadd231sd_fma(auVar77,auVar99,auVar16);
            local_278 = auVar36._0_8_;
            dVar55 = cos(dVar65);
            dVar65 = sin(dVar65);
            auVar100._8_8_ = 0;
            auVar100._0_8_ =
                 (double)local_258._0_8_ *
                 (double)local_258._0_8_ *
                 ((dVar56 * dVar56 * dVar55 * a0z * 3.141592653589793) / dVar112) * local_288;
            auVar78._8_8_ = 0;
            auVar78._0_8_ = local_288 * local_288 * dVar56 * dVar56 * dVar65 * a0y;
            auVar36 = vmulsd_avx512f(auVar78,ZEXT816(0x400921fb54442d18));
            auVar17._8_8_ = 0;
            auVar17._0_8_ = dVar57;
            auVar79._8_8_ = 0;
            auVar79._0_8_ = (auVar36._0_8_ / dVar86) * (double)local_258._0_8_ * dVar58;
            auVar36 = vfmadd231sd_fma(auVar79,auVar100,auVar17);
LAB_0010d259:
            auVar139 = ZEXT864(local_278);
            auVar138 = ZEXT1664(local_208);
            auVar137 = ZEXT864((ulong)local_248);
            auVar126 = ZEXT864(auVar37._0_8_);
            auVar92._8_8_ = 0;
            auVar92._0_8_ = local_248;
          }
          else {
            if (sscos == 3) {
              auVar36 = vmulsd_avx512f(auVar67,auVar87);
              vmovsd_avx512f(auVar46);
              vmovsd_avx512f(auVar48);
              dVar55 = (auVar36._0_8_ * 0.5) / dVar55;
              local_280 = cos(dVar55);
              local_270 = sin(dVar55);
              auVar103._8_8_ = 0;
              auVar103._0_8_ = local_288;
              auVar82._8_8_ = 0;
              auVar82._0_8_ = (double)local_258._0_8_ * (double)local_258._0_8_;
              auVar36 = vfmadd213sd_fma(auVar103,auVar103,auVar82);
              auVar36 = vsqrtsd_avx(auVar36,auVar36);
              dVar55 = 0.0;
              dVar56 = auVar36._0_8_;
              if (dVar56 <= dVar112) {
                dVar55 = cos((dVar56 * dVar56 * dVar56 * dVar56 * 3.141592653589793 * 0.5) / dVar52)
                ;
              }
              dVar56 = cos(dVar65);
              dVar57 = sin(dVar65);
              auVar104._8_8_ = 0;
              auVar104._0_8_ = local_280;
              auVar19._8_8_ = 0;
              auVar19._0_8_ = dVar56 * local_280;
              auVar83._8_8_ = 0;
              auVar83._0_8_ = local_280 * dVar57 * dVar54 * local_270;
              auVar36 = vfmadd231sd_fma(auVar83,auVar104,auVar19);
              local_248 = auVar36._0_8_ * dVar55 * dVar55 * a0y;
              local_288 = dVar55 * dVar55 * a0z;
            }
            else {
              if (sscos != 2) {
                if (sscos == 1) {
                  auVar36 = vmulsd_avx512f(auVar67,auVar47);
                  vmovsd_avx512f(auVar67);
                  vmovsd_avx512f(auVar46);
                  vmovsd_avx512f(auVar48);
                  auVar36 = vmulsd_avx512f(auVar67,auVar36);
                  auVar36 = vmulsd_avx512f(auVar67,auVar36);
                  dVar55 = (auVar36._0_8_ * 0.5) / dVar4;
                  dVar56 = cos(dVar55);
                  dVar57 = (local_288 * local_288 * local_288 * local_288 * 3.141592653589793 * 0.5)
                           / dVar52;
                  dVar58 = cos(dVar57);
                  dVar59 = ((double)local_258._0_8_ *
                            (double)local_258._0_8_ *
                            (double)local_258._0_8_ * (double)local_258._0_8_ * 3.141592653589793 *
                           0.5) / dVar125;
                  dVar60 = cos(dVar59);
                  dVar61 = sin(dVar55);
                  dVar57 = sin(dVar57);
                  dVar59 = sin(dVar59);
                  dVar55 = dVar60 * dVar58 * dVar58 * dVar60;
                  dVar62 = cos(dVar65);
                  dVar63 = (local_248 * local_248 * local_248 * 12.566370614359172) / dVar4;
                  dVar64 = sin(dVar65);
                  auVar93._8_8_ = 0;
                  auVar93._0_8_ = dVar56;
                  auVar10._8_8_ = 0;
                  auVar10._0_8_ = dVar62 * dVar56;
                  auVar70._8_8_ = 0;
                  auVar70._0_8_ = dVar56 * dVar64 * dVar63 * dVar61;
                  auVar36 = vfmsub231sd_fma(auVar70,auVar93,auVar10);
                  local_248 = auVar36._0_8_ * dVar55 * a0y;
                  dVar62 = sin(dVar65);
                  dVar64 = cos(dVar65);
                  auVar94._8_8_ = 0;
                  auVar94._0_8_ = dVar56;
                  auVar11._8_8_ = 0;
                  auVar11._0_8_ = dVar62 * dVar56;
                  auVar71._8_8_ = 0;
                  auVar71._0_8_ = dVar56 * dVar64 * dVar63 * dVar61;
                  auVar36 = vfmadd231sd_fma(auVar71,auVar94,auVar11);
                  local_208._8_8_ = 0;
                  local_208._0_8_ = auVar36._0_8_ * dVar55 * a0z;
                  auVar24._8_8_ = 0x8000000000000000;
                  auVar24._0_8_ = 0x8000000000000000;
                  local_218 = vxorpd_avx512vl(local_208,auVar24);
                  dVar55 = sin(dVar65);
                  dVar61 = cos(dVar65);
                  auVar95._8_8_ = 0;
                  auVar95._0_8_ =
                       dVar60 * dVar60 * dVar56 * dVar56 * ((local_288 *
                                                            local_288 *
                                                            local_288 *
                                                            dVar55 * a0y * 4.0 * 3.141592653589793)
                                                           / dVar52) * dVar58;
                  auVar12._8_8_ = 0;
                  auVar12._0_8_ = dVar57;
                  auVar72._8_8_ = 0;
                  auVar72._0_8_ =
                       dVar58 * dVar58 * dVar56 * dVar56 * (((double)local_258._0_8_ *
                                                            (double)local_258._0_8_ *
                                                            (double)local_258._0_8_ *
                                                            dVar61 * a0z * 4.0 * -3.141592653589793)
                                                           / dVar125) * dVar60 * dVar59;
                  auVar36 = vfmadd231sd_fma(auVar72,auVar95,auVar12);
                  local_278 = auVar36._0_8_;
                  dVar55 = cos(dVar65);
                  local_288 = dVar60 * dVar60 * dVar56 * dVar56 * ((local_288 *
                                                                   local_288 *
                                                                   local_288 *
                                                                   dVar55 * a0z * 4.0 *
                                                                   3.141592653589793) / dVar52) *
                              dVar58;
                  dVar55 = sin(dVar65);
                  auVar73._8_8_ = 0;
                  auVar73._0_8_ = dVar55 * a0y * 4.0;
                  auVar36 = vmulsd_avx512f(auVar73,ZEXT816(0x400921fb54442d18));
                  auVar96._8_8_ = 0;
                  auVar96._0_8_ = local_288;
                  auVar13._8_8_ = 0;
                  auVar13._0_8_ = dVar57;
                  auVar74._8_8_ = 0;
                  auVar74._0_8_ =
                       dVar58 * dVar58 * dVar56 * dVar56 * (((double)local_258._0_8_ *
                                                            (double)local_258._0_8_ *
                                                            (double)local_258._0_8_ * auVar36._0_8_)
                                                           / dVar125) * dVar60 * dVar59;
                  auVar36 = vfmadd231sd_fma(auVar74,auVar96,auVar13);
                  goto LAB_0010d259;
                }
                goto LAB_0010d53d;
              }
              auVar36 = vmulsd_avx512f(auVar67,auVar87);
              vmovsd_avx512f(auVar46);
              vmovsd_avx512f(auVar48);
              dVar55 = (auVar36._0_8_ * 0.5) / dVar55;
              local_280 = cos(dVar55);
              local_270 = sin(dVar55);
              auVar101._8_8_ = 0;
              auVar101._0_8_ = local_288;
              auVar80._8_8_ = 0;
              auVar80._0_8_ = (double)local_258._0_8_ * (double)local_258._0_8_;
              auVar36 = vfmadd213sd_fma(auVar101,auVar101,auVar80);
              auVar36 = vsqrtsd_avx(auVar36,auVar36);
              dVar56 = 1.0;
              dVar55 = auVar36._0_8_;
              if ((dVar55 != 0.0) || (NAN(dVar55))) {
                dVar55 = (dVar55 * 3.141592653589793) / ysigma;
                dVar56 = sin(dVar55);
                dVar56 = dVar56 / dVar55;
              }
              dVar55 = cos(dVar65);
              dVar57 = sin(dVar65);
              auVar102._8_8_ = 0;
              auVar102._0_8_ = local_280;
              auVar18._8_8_ = 0;
              auVar18._0_8_ = dVar55 * local_280;
              auVar81._8_8_ = 0;
              auVar81._0_8_ = local_280 * dVar57 * dVar54 * local_270;
              auVar36 = vfmadd231sd_fma(auVar81,auVar102,auVar18);
              local_248 = auVar36._0_8_ * dVar56 * a0y;
              local_288 = dVar56 * a0z;
            }
            dVar55 = sin(dVar65);
            local_258._0_8_ = dVar55 * local_280;
            dVar65 = cos(dVar65);
            auVar105._8_8_ = 0;
            auVar105._0_8_ = local_280;
            auVar137 = ZEXT864((ulong)local_248);
            auVar126 = ZEXT864(auVar37._0_8_);
            auVar36 = vxorpd_avx512vl(auVar39,auVar39);
            auVar139 = ZEXT1664(auVar36);
            auVar20._8_8_ = 0;
            auVar20._0_8_ = dVar55 * local_280;
            auVar84._8_8_ = 0;
            auVar84._0_8_ = local_280 * dVar65 * dVar53 * local_270;
            auVar36 = vfmadd231sd_fma(auVar84,auVar105,auVar20);
            auVar92._8_8_ = 0;
            auVar92._0_8_ = local_248;
            auVar21._8_8_ = 0;
            auVar21._0_8_ = local_288;
            auVar36 = vmulsd_avx512f(auVar36,auVar21);
            auVar138 = ZEXT1664(auVar36);
            auVar25._8_8_ = 0x8000000000000000;
            auVar25._0_8_ = 0x8000000000000000;
            local_218 = vxorpd_avx512vl(auVar36,auVar25);
            auVar36 = SUB6416(ZEXT864(0),0) << 0x40;
          }
LAB_0010d53d:
          auVar39 = vxorpd_avx512vl(local_218,auVar108);
          auVar49._0_8_ =
               (ulong)b_sign * auVar36._0_8_ + (ulong)!b_sign * (auVar36._0_8_ ^ 0x8000000000000000)
          ;
          auVar49._8_8_ = auVar36._8_8_ ^ 0x8000000000000000;
          auVar85 = ZEXT1664(auVar49);
          auVar50._0_8_ =
               (ulong)b_sign * auVar92._0_8_ + (ulong)!b_sign * (auVar92._0_8_ ^ 0x8000000000000000)
          ;
          auVar50._8_8_ = auVar92._8_8_ ^ 0x8000000000000000;
          auVar106 = ZEXT1664(auVar50);
          auVar46 = auVar137._0_16_;
          auVar36 = vmulsd_avx512f(auVar38,auVar46);
          auVar51._0_8_ = (ulong)b_sign * local_218._0_8_ + (ulong)!b_sign * auVar39._0_8_;
          auVar51._8_8_ = auVar39._8_8_;
          auVar140 = ZEXT1664(auVar51);
          auVar39 = vmulsd_avx512f(auVar44,auVar46);
          auVar47 = auVar139._0_16_;
          auVar36 = vfmadd231sd_avx512f(auVar36,auVar47,auVar121);
          pcVar22 = (this->ce).p._M_t.
                    super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                    super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                    super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar33][lVar34];
          auVar40 = auVar138._0_16_;
          auVar36 = vfmadd231sd_avx512f(auVar36,auVar40,auVar122);
          auVar45 = auVar126._0_16_;
          if (append) {
            auVar39 = vfmadd231sd_avx512f(auVar39,auVar47,auVar119);
            auVar39 = vfmadd231sd_avx512f(auVar39,auVar40,auVar43);
            auVar36 = vunpcklpd_avx(auVar36,auVar39);
            pdVar2 = (double *)((long)&pcVar22->ex + lVar32);
            dVar55 = pdVar2[1];
            auVar116._8_8_ = auVar49._0_8_;
            auVar116._0_8_ = auVar49._0_8_;
            pdVar3 = (double *)((long)&pcVar22->ex + lVar32);
            *pdVar3 = auVar36._0_8_ + *pdVar2;
            pdVar3[1] = auVar36._8_8_ + dVar55;
            auVar36 = vmulsd_avx512f(auVar45,auVar46);
            auVar36 = vfmadd231sd_avx512f(auVar36,auVar47,auVar35);
            auVar36 = vfmadd231sd_avx512f(auVar36,auVar40,auVar66);
            *(double *)((long)&pcVar22->ez + lVar32) =
                 auVar36._0_8_ + *(double *)((long)&pcVar22->ez + lVar32);
            auVar36 = vmovddup_avx512vl(auVar51);
            auVar110._0_8_ = auVar38._0_8_ * auVar36._0_8_;
            auVar110._8_8_ = auVar38._8_8_ * auVar36._8_8_;
            auVar36 = vfmadd132pd_fma(auVar116,auVar110,auVar42);
            auVar111._8_8_ = auVar50._0_8_;
            auVar111._0_8_ = auVar50._0_8_;
            pcVar30 = (this->cb).p._M_t.
                      super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                      super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                      super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar33][lVar34];
            auVar36 = vfmadd213pd_fma(auVar111,auVar122,auVar36);
            pdVar2 = (double *)((long)&pcVar30->bx + lVar32);
            dVar55 = pdVar2[1];
            pdVar3 = (double *)((long)&pcVar30->bx + lVar32);
            *pdVar3 = auVar36._0_8_ + *pdVar2;
            pdVar3[1] = auVar36._8_8_ + dVar55;
            auVar36 = vmulsd_avx512f(auVar45,auVar51);
            auVar36 = vfmadd213sd_fma(auVar49,auVar35,auVar36);
            auVar36 = vfmadd213sd_fma(auVar50,auVar66,auVar36);
            dVar55 = auVar36._0_8_ + *(double *)((long)&pcVar30->bz + lVar32);
          }
          else {
            *(long *)((long)&pcVar22->ex + lVar32) = auVar36._0_8_;
            auVar36 = vmulsd_avx512f(auVar45,auVar46);
            auVar39 = vfmadd231sd_avx512f(auVar39,auVar47,auVar119);
            auVar36 = vfmadd231sd_avx512f(auVar36,auVar47,auVar35);
            auVar39 = vfmadd231sd_avx512f(auVar39,auVar40,auVar43);
            auVar36 = vfmadd231sd_avx512f(auVar36,auVar40,auVar66);
            *(long *)((long)&pcVar22->ey + lVar32) = auVar39._0_8_;
            *(long *)((long)&pcVar22->ez + lVar32) = auVar36._0_8_;
            auVar36 = vmulsd_avx512f(auVar38,auVar51);
            auVar36 = vfmadd231sd_fma(auVar36,auVar49,auVar121);
            auVar36 = vfmadd231sd_fma(auVar36,auVar50,auVar122);
            pcVar30 = (this->cb).p._M_t.
                      super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                      super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                      super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar33][lVar34];
            *(long *)((long)&pcVar30->bx + lVar32) = auVar36._0_8_;
            auVar36 = vmulsd_avx512f(auVar44,auVar51);
            auVar36 = vfmadd231sd_fma(auVar36,auVar49,auVar119);
            auVar36 = vfmadd231sd_avx512f(auVar36,auVar50,auVar43);
            *(long *)((long)&pcVar30->by + lVar32) = auVar36._0_8_;
            auVar36 = vmulsd_avx512f(auVar45,auVar51);
            auVar36 = vfmadd231sd_fma(auVar36,auVar35,auVar49);
            auVar36 = vfmadd231sd_fma(auVar36,auVar66,auVar50);
            dVar55 = auVar36._0_8_;
          }
          auVar120 = ZEXT864((ulong)z0);
          auVar123 = ZEXT864((ulong)y0);
          auVar130 = ZEXT864(local_120);
          auVar133 = ZEXT864(local_128);
          auVar136 = ZEXT864(local_118);
          in_ZMM25 = ZEXT864(local_110);
          *(double *)((long)&pcVar30->bz + lVar32) = dVar55;
        }
        else {
LAB_0010ce94:
          if (!append) {
            pcVar22 = (this->ce).p._M_t.
                      super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                      super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                      super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar33][lVar34];
            puVar1 = (undefined8 *)((long)&pcVar22->ex + lVar32);
            *puVar1 = 0;
            puVar1[1] = 0;
            *(undefined8 *)((long)&pcVar22->ez + lVar32) = 0;
            pcVar30 = (this->cb).p._M_t.
                      super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                      super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                      super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar33][lVar34];
            *(undefined8 *)((long)&pcVar30->bz + lVar32) = 0;
            puVar1 = (undefined8 *)((long)&pcVar30->bx + lVar32);
            *puVar1 = 0;
            puVar1[1] = 0;
          }
        }
        uVar31 = uVar31 + 1;
        lVar32 = lVar32 + 0x18;
      }
    }
    lVar33 = lVar33 + 1;
  } while( true );
}

Assistant:

void spatial_region::f_init_cos(double a0y, double a0z, double xsigma, double ysigma, double zsigma, double x0, int sscos, bool b_sign, double x1, double phase, double y0, double z0, bool append, double phi, double xtarget, double ytarget, double ztarget)
{
    /* Для f_init_gauss xsigma, ysigma и zsigma имели смысл
     * половины масштабов лазерного импульса на уровне 1/e^2 (по
     * интенсивности) */
    /* x0 - расстояние от левой границы области (spatial_region'а) до
     * центра лазерного импульса, x1 - координата по x центра импульса
     * относительно центра всей области моделирования («суммы»
     * spatial_region'ов) */
    /* Интеграл от квадратов полей не вычисляется аналитически в
     * простой форме, поэтому используется \int a^2 dV. Поля задаются
     * таким образом, чтобы \int a^2 dV имел то же значение, что и для
     * f_init_gauss, поэтому вместо xsigma, ysigma и zsigma для
     * описания огибающей используются половины полных размеров
     * импульса xs, ys и zs */
    /* Если sscos==1, то огибающая задаётся в форме "супер-супер
     * косинуса"; для того, чтобы вычисление a_0 по энергии импульса
     * (при задании в конфиг-файле W) было верным, ширина импульса
     * вычисляется так, чтобы интеграл от квадрата его огибающей
     * совпадал с соответствующим интегралом от гауссова импульса */
    /* Если sscos == 2 (pearl), то поперечная огибающая для поля имеет вид (sin
     * r / r)^2, продольная - как для cos. zsigma не используется, ysigma -
     * расстояние от оси до первого нуля интенсивности в поперечном
     * распределении, xsigma - половина размера лазерного импульса на уровне
     * 1/e^2 (по интенсивности). E_x не вычисляется, а полагается равным нулю. */
    // sscos = 3 - sscos transverse, cos longutudinal
    double x,y,z,xi;
    double xs{0}, ys{0}, zs{0};
    if (sscos==0) {
        xs = xsigma*2*sqrt(2*PI)/3;
        ys = ysigma*2*sqrt(2*PI)/3;
        zs = zsigma*2*sqrt(2*PI)/3;
    } else if (sscos == 1) {
        xs = 0.822*xsigma;
        ys = 0.822*ysigma;
        zs = 0.822*zsigma;
    } else if (sscos == 2) {
        xs = xsigma * 2 * sqrt(2 * PI) / 3;
        ys = 1e2 * ysigma; // just >> ysigma
        zs = 1e2 * ysigma; // just >> ysigma
    } else if (sscos == 3) {
        xs = xsigma * 2 * sqrt(2 * PI) / 3;
        ys = 0.822 * ysigma;
        zs = 0.822 * zsigma;
    }
    double cosx,cosy,cosz,sinx,siny,sinz,tr_envelope;
    double y12,z12;
    y12 = 0.5*ny*dy;
    z12 = 0.5*nz*dz;
    double r0x,r0y,r0z;
    r0x = sqrt(x1*x1+y0*y0+z0*z0);
    r0y = -y0/r0x;
    r0z = -z0/r0x;
    r0x = -x1/r0x;
    double y0x,y0y,y0z,z0x,z0y,z0z;
    y0z = sqrt( r0x*r0x + r0y*r0y );
    if (y0z!=0)
    {
        y0x = -r0y/y0z;
        y0y = r0x/y0z;
        y0z = 0;
    }
    else
    {
        y0x = 0;
        y0y = 1;
        y0z = 0;
    }
    z0x = r0y*y0z - r0z*y0y;
    z0y = r0z*y0x - r0x*y0z;
    z0z = r0x*y0y - r0y*y0x;
    if (phi!=0) {
        double c,s,yx,yy,yz,zx,zy,zz;
        c = cos(phi);
        s = sin(phi);
        yx = y0x;
        yy = y0y;
        yz = y0z;
        zx = z0x;
        zy = z0y;
        zz = z0z;
        y0x = yx*c + zx*s;
        y0y = yy*c + zy*s;
        y0z = yz*c + zz*s;
        z0x = zx*c - yx*s;
        z0y = zy*c - yy*s;
        z0z = zz*c - yz*s;
    }
    double ex{0}, ey{0}, ez{0}, bx{0}, by{0}, bz{0};
    for(int i=0;i<nx;i++)
    {
        for(int j=0;j<ny;j++)
        {
            for(int k=0;k<nz;k++)
            {
                x = r0x*(i*dx-x0-xtarget) + r0y*(j*dy-y12-y0-ytarget) + r0z*(k*dz-z12-z0-ztarget);
                xi = x + phase;
                y = y0x*(i*dx-x0-xtarget) + y0y*(j*dy-y12-y0-ytarget) + y0z*(k*dz-z12-z0-ztarget);
                z = z0x*(i*dx-x0-xtarget) + z0y*(j*dy-y12-y0-ytarget) + z0z*(k*dz-z12-z0-ztarget);
                // vector potential envelope = (cosx*cosy*cosz)^2;
                if (x<xs&&x>-xs&&y<ys&&y>-ys&&z<zs&&z>-zs)
                {
                    if (sscos==0) {
                        cosx = cos(PI*x/2/xs);
                        cosy = cos(PI*y/2/ys);
                        cosz = cos(PI*z/2/zs);
                        sinx = sin(PI*x/2/xs);
                        siny = sin(PI*y/2/ys);
                        sinz = sin(PI*z/2/zs);
                        tr_envelope = cosy*cosy*cosz*cosz;
                        ey = a0y*tr_envelope*(cos(xi)*cosx*cosx - PI/xs*sin(xi)*cosx*sinx);
                        ez = a0z*tr_envelope*(sin(xi)*cosx*cosx + PI/xs*cos(xi)*cosx*sinx);
                        bz = ey;
                        by = -ez;
                        ex = a0y*sin(xi)*cosx*cosx*cosz*cosz*PI/ys*cosy*siny - a0z*cos(xi)*cosx*cosx*cosy*cosy*PI/zs*cosz*sinz;
                        bx = a0z*cos(xi)*cosx*cosx*PI/ys*cosz*cosz*cosy*siny + a0y*sin(xi)*cosx*cosx*cosy*cosy*PI/zs*cosz*sinz;
                    } else if (sscos == 1) {
                        cosx = cos(PI*x*x*x*x/2/(xs*xs*xs*xs));
                        cosy = cos(PI*y*y*y*y/2/(ys*ys*ys*ys));
                        cosz = cos(PI*z*z*z*z/2/(zs*zs*zs*zs));
                        sinx = sin(PI*x*x*x*x/2/(xs*xs*xs*xs));
                        siny = sin(PI*y*y*y*y/2/(ys*ys*ys*ys));
                        sinz = sin(PI*z*z*z*z/2/(zs*zs*zs*zs));
                        tr_envelope = cosy*cosy*cosz*cosz;
                        ey = a0y*tr_envelope*(cos(xi)*cosx*cosx - 4*PI*x*x*x/(xs*xs*xs*xs)*sin(xi)*cosx*sinx);
                        ez = a0z*tr_envelope*(sin(xi)*cosx*cosx + 4*PI*x*x*x/(xs*xs*xs*xs)*cos(xi)*cosx*sinx);
                        bz = ey;
                        by = -ez;
                        ex = a0y*sin(xi)*4*PI*y*y*y/(ys*ys*ys*ys)*cosx*cosx*cosz*cosz*cosy*siny - a0z*cos(xi)*4*PI*z*z*z/(zs*zs*zs*zs)*cosx*cosx*cosy*cosy*cosz*sinz;
                        bx = a0z*cos(xi)*4*PI*y*y*y/(ys*ys*ys*ys)*cosx*cosx*cosz*cosz*cosy*siny + a0y*sin(xi)*4*PI*z*z*z/(zs*zs*zs*zs)*cosx*cosx*cosy*cosy*cosz*sinz;
                    } else if (sscos == 2) {
                        cosx = cos(PI*x/2/xs);
                        sinx = sin(PI*x/2/xs);
                        double r = sqrt(y * y + z * z);
                        if (r != 0) {
                            siny = sin(PI * r / ysigma) / (PI * r / ysigma);
                        } else {
                            siny = 1;
                        }
                        ey = a0y * siny * (cos(xi)*cosx*cosx - PI/xs*sin(xi)*cosx*sinx);
                        ez = a0z * siny * (sin(xi)*cosx*cosx + PI/xs*cos(xi)*cosx*sinx);
                        bz = ey;
                        by = -ez;
                        ex = 0;
                        bx = 0;
                    }
                    else if (sscos == 3) {
                        cosx = cos(PI*x/2/xs);
                        sinx = sin(PI*x/2/xs);
                        double r = sqrt(y * y + z * z);
                        if (r <= ys)
                        {
                            cosy = cos(PI*r*r*r*r/2/(ys*ys*ys*ys));
                        }
                        else
                        {
                            cosy = 0.0;
                        }
                        ey = a0y * cosy * cosy * (cos(xi)*cosx*cosx - PI/xs*sin(xi)*cosx*sinx);
                        ez = a0z * cosy * cosy * (sin(xi)*cosx*cosx + PI/xs*cos(xi)*cosx*sinx);
                        bz = ey;
                        by = -ez;
                        ex = 0;
                        bx = 0;
                    }
                    if (b_sign==0)
                    {
                        bx = -bx;
                        by = -by;
                        bz = -bz;
                    }
                    if (append==0)
                    {
                        // прежние значения перезаписываются
                        ce[i][j][k].ex = ex*r0x + ey*y0x + ez*z0x;
                        ce[i][j][k].ey = ex*r0y + ey*y0y + ez*z0y;
                        ce[i][j][k].ez = ex*r0z + ey*y0z + ez*z0z;
                        cb[i][j][k].bx = bx*r0x + by*y0x + bz*z0x;
                        cb[i][j][k].by = bx*r0y + by*y0y + bz*z0y;
                        cb[i][j][k].bz = bx*r0z + by*y0z + bz*z0z;
                    }
                    else
                    {
                        // импульс добавляется к имеющимся полям
                        ce[i][j][k].ex += ex*r0x + ey*y0x + ez*z0x;
                        ce[i][j][k].ey += ex*r0y + ey*y0y + ez*z0y;
                        ce[i][j][k].ez += ex*r0z + ey*y0z + ez*z0z;
                        cb[i][j][k].bx += bx*r0x + by*y0x + bz*z0x;
                        cb[i][j][k].by += bx*r0y + by*y0y + bz*z0y;
                        cb[i][j][k].bz += bx*r0z + by*y0z + bz*z0z;
                    }
                }
                else if (append==0)
                {
                    ce[i][j][k].ex = 0;
                    ce[i][j][k].ey = 0;
                    ce[i][j][k].ez = 0;
                    cb[i][j][k].bx = 0;
                    cb[i][j][k].by = 0;
                    cb[i][j][k].bz = 0;
                }
            }
        }
    }
}